

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O3

void __thiscall
cmCTestCoverageHandler::EndCoverageLogXML(cmCTestCoverageHandler *this,cmXMLWriter *xml)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  double dVar2;
  string local_58;
  string local_38;
  
  paVar1 = &local_58.field_2;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"EndDateTime","");
  cmCTest::CurrentTime_abi_cxx11_(&local_38,(this->super_cmCTestGenericHandler).CTest);
  cmXMLWriter::StartElement(xml,&local_58);
  cmXMLWriter::Content<std::__cxx11::string>(xml,&local_38);
  cmXMLWriter::EndElement(xml);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_38._M_dataplus._M_p._4_4_,local_38._M_dataplus._M_p._0_4_) !=
      &local_38.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_38._M_dataplus._M_p._4_4_,local_38._M_dataplus._M_p._0_4_),
                    local_38.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"EndTime","");
  dVar2 = cmsys::SystemTools::GetTime();
  local_38._M_dataplus._M_p._0_4_ = (undefined4)(long)dVar2;
  cmXMLWriter::Element<unsigned_int>(xml,&local_58,(uint *)&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  cmXMLWriter::EndElement(xml);
  cmCTest::EndXML((this->super_cmCTestGenericHandler).CTest,xml);
  return;
}

Assistant:

void cmCTestCoverageHandler::EndCoverageLogXML(cmXMLWriter& xml)
{
  xml.Element("EndDateTime", this->CTest->CurrentTime());
  xml.Element("EndTime", static_cast<unsigned int>(cmSystemTools::GetTime()));
  xml.EndElement(); // CoverageLog
  this->CTest->EndXML(xml);
}